

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkMutableDescriptorTypeCreateInfoEXT *create_info,ScratchAllocator *alloc)

{
  VkMutableDescriptorTypeListEXT *pVVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  void *pvVar5;
  void *__dest;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar3 = *(undefined8 *)create_info;
    pvVar5 = create_info->pNext;
    pVVar1 = create_info->pMutableDescriptorTypeLists;
    puVar4[2] = *(undefined8 *)&create_info->mutableDescriptorTypeListCount;
    puVar4[3] = pVVar1;
    *puVar4 = uVar3;
    puVar4[1] = pvVar5;
  }
  if (puVar4[3] != 0) {
    if ((ulong)create_info->mutableDescriptorTypeListCount == 0) {
      pvVar5 = (void *)0x0;
    }
    else {
      pVVar1 = create_info->pMutableDescriptorTypeLists;
      sVar8 = (ulong)create_info->mutableDescriptorTypeListCount << 4;
      pvVar5 = ScratchAllocator::allocate_raw(alloc,sVar8,0x10);
      if (pvVar5 != (void *)0x0) {
        memmove(pvVar5,pVVar1,sVar8);
      }
    }
    puVar4[3] = pvVar5;
  }
  if (*(int *)(puVar4 + 2) != 0) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      lVar2 = puVar4[3];
      pvVar5 = *(void **)(lVar2 + lVar7);
      if (pvVar5 != (void *)0x0) {
        uVar9 = (ulong)*(uint *)(lVar2 + -8 + lVar7);
        if (uVar9 == 0) {
          __dest = (void *)0x0;
        }
        else {
          sVar8 = uVar9 << 2;
          __dest = ScratchAllocator::allocate_raw(alloc,sVar8,0x10);
          if (__dest != (void *)0x0) {
            memmove(__dest,pvVar5,sVar8);
          }
        }
        *(void **)(lVar2 + lVar7) = __dest;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < *(uint *)(puVar4 + 2));
  }
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkMutableDescriptorTypeCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pMutableDescriptorTypeLists)
		info->pMutableDescriptorTypeLists = copy(create_info->pMutableDescriptorTypeLists, create_info->mutableDescriptorTypeListCount, alloc);

	for (uint32_t i = 0; i < info->mutableDescriptorTypeListCount; i++)
	{
		auto &l = const_cast<VkMutableDescriptorTypeListEXT &>(info->pMutableDescriptorTypeLists[i]);
		if (l.pDescriptorTypes)
			l.pDescriptorTypes = copy(l.pDescriptorTypes, l.descriptorTypeCount, alloc);
	}

	return info;
}